

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kgc.cpp
# Opt level: O3

void __thiscall Kgc::mark(Kgc *this,Value *v)

{
  ulong uVar1;
  long lVar2;
  CompoundProc *cp;
  long lVar3;
  
  uVar1 = (ulong)v & 3;
  while ((uVar1 == 0 && (v->marked_ == 0))) {
    v->marked_ = 1;
    if (v->type_ == COMP_PROC) {
      mark(this,(Value *)v[1]._vptr_Value);
      lVar3 = 0x28;
      lVar2 = 0x20;
    }
    else {
      if (v->type_ != CELL) {
        return;
      }
      lVar3 = 0x20;
      lVar2 = 0x18;
    }
    mark(this,*(Value **)((long)&v->_vptr_Value + lVar2));
    v = *(Value **)((long)&v->_vptr_Value + lVar3);
    uVar1 = (ulong)v & 3;
  }
  return;
}

Assistant:

void Kgc::mark(const Value *v)
{
    if (IS_INT(v) || IS_CHR(v)) return;
    if (v->marked_) return;
    
    v->marked_ = 1;
    if (v->type() == ValueType::CELL)
    {
        const Cell *c = static_cast<const Cell *>(v);
        mark(c->head_);
        mark(c->tail_);
    } else if (v->type() == ValueType::COMP_PROC)
    {
        const CompoundProc *cp = static_cast<const CompoundProc *>(v);
        mark(cp->parameters_);
        mark(cp->body_);
        mark(cp->env_);
    }
}